

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECParameters.cpp
# Opt level: O2

bool __thiscall ECParameters::deserialise(ECParameters *this,ByteString *serialised)

{
  size_t sVar1;
  ByteString dEC;
  ByteString BStack_38;
  
  ByteString::chainDeserialise(&BStack_38,serialised);
  sVar1 = ByteString::size(&BStack_38);
  if (sVar1 != 0) {
    ByteString::operator=(&this->ec,&BStack_38);
  }
  ByteString::~ByteString(&BStack_38);
  return sVar1 != 0;
}

Assistant:

bool ECParameters::deserialise(ByteString& serialised)
{
	ByteString dEC = ByteString::chainDeserialise(serialised);

	if (dEC.size() == 0)
	{
		return false;
	}

	setEC(dEC);

	return true;
}